

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O3

bool operator==(CPubKey *a,CPubKey *b)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  size_t __n;
  long in_FS_OFFSET;
  bool bVar4;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = a->vch[0];
  if (bVar1 == b->vch[0]) {
    __n = 0x21;
    if ((bVar1 & 0xfe) != 2) {
      if ((byte)(bVar1 - 4) < 4) {
        __n = *(size_t *)(&DAT_00e3c9f0 + (ulong)(byte)(bVar1 - 4) * 8);
      }
      else {
        __n = 0;
      }
    }
    iVar3 = bcmp(a,b,__n);
    bVar4 = iVar3 == 0;
  }
  else {
    bVar4 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool operator==(const CPubKey& a, const CPubKey& b)
    {
        return a.vch[0] == b.vch[0] &&
               memcmp(a.vch, b.vch, a.size()) == 0;
    }